

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMocker<std::error_code_(unsigned_long)>::PerformDefaultAction
          (FunctionMocker<std::error_code_(unsigned_long)> *this,ArgumentTuple *args,
          string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  Action<std::error_code_(unsigned_long)> *this_00;
  error_category *peVar4;
  error_category *extraout_RDX;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  OnCallSpec<std::error_code_(unsigned_long)> *this_01;
  Result RVar6;
  Result RVar7;
  string message;
  long *local_58 [2];
  long local_48 [2];
  _Head_base<0UL,_unsigned_long,_false> local_38;
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar5 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<std::error_code_(unsigned_long)> *)0x0;
      break;
    }
    this_01 = (OnCallSpec<std::error_code_(unsigned_long)> *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    bVar2 = OnCallSpec<std::error_code_(unsigned_long)>::Matches(this_01,args);
  } while (!bVar2);
  if (this_01 == (OnCallSpec<std::error_code_(unsigned_long)> *)0x0) {
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_58);
    if (DefaultValue<std::error_code>::producer_ == (long *)0x0) {
      peVar4 = (error_category *)std::_V2::system_category();
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*DefaultValue<std::error_code>::producer_ + 0x10))();
      peVar4 = extraout_RDX;
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  else {
    this_00 = OnCallSpec<std::error_code_(unsigned_long)>::GetAction(this_01);
    local_38._M_head_impl =
         (args->super__Tuple_impl<0UL,_unsigned_long>).super__Head_base<0UL,_unsigned_long,_false>.
         _M_head_impl;
    RVar6 = Action<std::error_code_(unsigned_long)>::Perform(this_00,(ArgumentTuple *)&local_38);
    peVar4 = RVar6._M_cat;
    uVar3 = RVar6._M_value;
  }
  RVar7._4_4_ = 0;
  RVar7._M_value = uVar3;
  RVar7._M_cat = peVar4;
  return RVar7;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }